

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O1

void __thiscall
SolutionNeighbourhood::SolutionNeighbourhood(SolutionNeighbourhood *this,Solution *solution)

{
  pointer *pppNVar1;
  iterator __position;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar2;
  _Base_ptr p_Var3;
  
  this->solution = solution;
  this->lastMove = (Move *)0x0;
  (this->nurseVector).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nurseVector).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nurseVector).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->phase = 0;
  this->iterator1 = 0;
  this->iterator2 = 0;
  this->iteratorTurn1 = 0;
  *(undefined8 *)((long)&this->iteratorTurn1 + 1) = 0;
  pmVar2 = Solution::getNurses_abi_cxx11_(solution);
  p_Var3 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pmVar2 = Solution::getNurses_abi_cxx11_(solution);
    if ((_Rb_tree_header *)p_Var3 == &(pmVar2->_M_t)._M_impl.super__Rb_tree_header) break;
    __position._M_current =
         (this->nurseVector).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->nurseVector).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<NurseSolution*,std::allocator<NurseSolution*>>::
      _M_realloc_insert<NurseSolution*const&>
                ((vector<NurseSolution*,std::allocator<NurseSolution*>> *)&this->nurseVector,
                 __position,(NurseSolution **)(p_Var3 + 2));
    }
    else {
      *__position._M_current = *(NurseSolution **)(p_Var3 + 2);
      pppNVar1 = &(this->nurseVector).
                  super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  }
  return;
}

Assistant:

SolutionNeighbourhood::SolutionNeighbourhood(Solution* solution) : solution(solution){
    this->phase = 0;
    this->iterator1 = 0;
    this->iterator2 = 0;
    this->iteratorTurn1 = 0;
    this->iteratorTurn2 = 0;

    for(auto it = solution->getNurses().begin(); it != solution->getNurses().end(); ++it ) {
        this->nurseVector.push_back( it->second );
    }
}